

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O0

int YP_md_joint_vel(YPSpur *spur,int id,double v)

{
  int iVar1;
  undefined1 local_60 [8];
  YPSpur_msg msg;
  double v_local;
  int id_local;
  YPSpur *spur_local;
  
  local_60 = (undefined1  [8])0x1;
  msg.msg_type = (long)spur->pid;
  msg.pid._0_4_ = 0x801;
  msg.pid._4_4_ = id;
  msg._16_8_ = v;
  msg.data[3] = v;
  iVar1 = (*(spur->dev).send)(&spur->dev,(YPSpur_msg *)local_60);
  if (iVar1 < 0) {
    spur->connection_error = 1;
    spur_local._4_4_ = -1;
  }
  else {
    spur_local._4_4_ = 1;
  }
  return spur_local._4_4_;
}

Assistant:

int YP_md_joint_vel(YPSpur* spur, int id, double v)
{
  YPSpur_msg msg;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_JOINT_VEL;
  msg.cs = id;
  msg.data[0] = v;

  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  return 1;
}